

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::primary_expr(analysis *this)

{
  bool bVar1;
  TYPE TVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  analysis *in_RSI;
  string *this_00;
  NodePtr NVar4;
  int lineno;
  string tmp_str;
  int tmp_int;
  allocator local_101;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 == NUMINT) {
    local_e0._0_4_ = numberInteger(in_RSI);
    std::make_shared<dh::TreeNode,int&,int&>((int *)local_100,(int *)local_e0);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    local_100._0_4_ = 1.4013e-45;
    TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_100);
    local_100._0_4_ = 1.54143e-44;
    TreeNode::setKind(*(TreeNode **)this,(int *)local_100);
    local_100._0_4_ = 2.8026e-45;
    TreeNode::setType(*(TreeNode **)this,(int *)local_100);
    _Var3._M_pi = extraout_RDX;
    goto LAB_00118436;
  }
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 == NUMFLOAT) {
    local_e0._0_4_ = numberFloat(in_RSI);
    std::make_shared<dh::TreeNode,float&,int&>((float *)local_100,(int *)local_e0);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    local_100._0_4_ = 1.4013e-45;
    TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_100);
    local_100._0_4_ = 1.68156e-44;
    TreeNode::setKind(*(TreeNode **)this,(int *)local_100);
    local_100._0_4_ = 4.2039e-45;
    TreeNode::setType(*(TreeNode **)this,(int *)local_100);
    _Var3._M_pi = extraout_RDX_00;
    goto LAB_00118436;
  }
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 != NUMBOOLEAN) {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != STRING) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 == ID) {
        identifier_abi_cxx11_((string *)local_100,in_RSI);
        std::make_shared<dh::TreeNode,std::__cxx11::string&,int&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (int *)local_100);
        std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
        local_e0._0_4_ = 1;
        TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_e0);
        token::getVal_abi_cxx11_
                  ((string *)local_e0,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e0,"[");
        std::__cxx11::string::~string((string *)local_e0);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_60,"[",(allocator *)local_e0);
          match(in_RSI,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          local_e0._0_4_ = 8;
          TreeNode::setKind(*(TreeNode **)this,(int *)local_e0);
          assignment_expr((analysis *)local_e0);
          std::__cxx11::string::string((string *)&local_80,"]",&local_101);
          match(in_RSI,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_e0);
LAB_00118415:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
        }
        else {
          token::getVal_abi_cxx11_
                    ((string *)local_e0,
                     (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e0,"(");
          std::__cxx11::string::~string((string *)local_e0);
          if (bVar1) {
            local_e0._0_4_ = 9;
            TreeNode::setKind(*(TreeNode **)this,(int *)local_e0);
            arg_list((analysis *)local_e0);
            TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_e0);
            goto LAB_00118415;
          }
          local_e0._0_4_ = 0xf;
          TreeNode::setKind(*(TreeNode **)this,(int *)local_e0);
        }
        this_00 = (string *)local_100;
      }
      else {
        std::__cxx11::string::string((string *)&local_a0,"(",(allocator *)local_100);
        match(in_RSI,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        assignment_expr((analysis *)local_100);
        std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_100);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
        std::__cxx11::string::string((string *)(local_e0 + 0x20),")",(allocator *)local_100);
        match(in_RSI,(string *)(local_e0 + 0x20));
        this_00 = (string *)(local_e0 + 0x20);
      }
      std::__cxx11::string::~string(this_00);
      _Var3._M_pi = extraout_RDX_02;
      goto LAB_00118436;
    }
  }
  token::getVal_abi_cxx11_
            ((string *)local_100,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::make_shared<dh::TreeNode,std::__cxx11::string,int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
             (int *)local_100);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e0 + 8));
  std::__cxx11::string::~string((string *)local_100);
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 == NUMBOOLEAN) {
    local_100._0_4_ = 0.0;
    TreeNode::setType(*(TreeNode **)this,(int *)local_100);
    local_100._0_4_ = 1.82169e-44;
    TreeNode::setKind(*(TreeNode **)this,(int *)local_100);
  }
  else {
    local_100._0_4_ = 1.4013e-45;
    TreeNode::setType(*(TreeNode **)this,(int *)local_100);
    local_100._0_4_ = 1.96182e-44;
    TreeNode::setKind(*(TreeNode **)this,(int *)local_100);
  }
  token::getVal_abi_cxx11_
            (&local_40,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  match(in_RSI,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_100._0_4_ = 1.4013e-45;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_100);
  _Var3._M_pi = extraout_RDX_01;
LAB_00118436:
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar4.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::primary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in primary_expr\n";
#endif
	NodePtr ret;

	int lineno = tmp->getLineno();
	if ( tmp->getType() == TYPE::NUMINT)
	{
		int tmp_int = numberInteger();
		ret = ::std::make_shared<TreeNode>(tmp_int,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::INTLITERAL);
		ret->setType(TypeKind::IntK);
	} else if ( tmp->getType() == TYPE::NUMFLOAT)
	{
		float tmp_float = numberFloat();
		ret = ::std::make_shared<TreeNode>(tmp_float,lineno);
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::FLOATLITERAL);
		ret->setType(TypeKind::FloatK);
	} else if ( tmp->getType() == TYPE::NUMBOOLEAN || tmp->getType() == TYPE::STRING)
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),lineno);

		if ( tmp->getType() == TYPE::NUMBOOLEAN){
			ret->setType(TypeKind::BoolK);
			ret->setKind(ExprKind::BOOLLITERAL);
		} else 
		{
			ret->setType(TypeKind::StringK);
			ret->setKind(ExprKind::STRINGLITERAL);
		}
		match(tmp->getVal());
		ret->setNodeKind(NodeKind::ExprK);
	} else if ( tmp->getType() == TYPE::ID)
	{
		::std::string tmp_str = identifier();

		ret = ::std::make_shared<TreeNode>(tmp_str,lineno);
		ret->setNodeKind(NodeKind::ExprK);

		if ( tmp->getVal() == "[")
		{
			match("[");
			ret->setKind(ExprKind::ArrayExp);
			NodePtr tmp_ptr = expr();
			match("]");
			ret->appendChild(tmp_ptr);
		} else if ( tmp->getVal() == "(")
		{
			ret->setKind(ExprKind::FuncExp);
			NodePtr tmp_ptr = arg_list();
			ret->appendChild(tmp_ptr);
		} else 
		{
			ret->setKind(ExprKind::IdK);
		}
	} else 
	{
		match("(");
		ret = expr();
		match(")");
	}

	return ret;
}